

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetCreateRuleVariable
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *lang,string *config)

{
  string var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  switch(this->Target->TargetTypeValue) {
  case EXECUTABLE:
    std::operator+(&bStack_68,"CMAKE_",lang);
    std::operator+(__return_storage_ptr__,&bStack_68,"_LINK_EXECUTABLE");
    break;
  case STATIC_LIBRARY:
    std::operator+(&local_48,"CMAKE_",lang);
    std::operator+(&bStack_68,&local_48,"_CREATE_STATIC_LIBRARY");
    std::__cxx11::string::~string((string *)&local_48);
    GetFeatureSpecificLinkRuleVariable(__return_storage_ptr__,this,&bStack_68,lang,config);
    break;
  case SHARED_LIBRARY:
    std::operator+(&bStack_68,"CMAKE_",lang);
    std::operator+(__return_storage_ptr__,&bStack_68,"_CREATE_SHARED_LIBRARY");
    break;
  case MODULE_LIBRARY:
    std::operator+(&bStack_68,"CMAKE_",lang);
    std::operator+(__return_storage_ptr__,&bStack_68,"_CREATE_SHARED_MODULE");
    break;
  default:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&bStack_68);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)&bStack_68);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetCreateRuleVariable(
  std::string const& lang, std::string const& config) const
{
  switch (this->GetType()) {
    case cmStateEnums::STATIC_LIBRARY: {
      std::string var = "CMAKE_" + lang + "_CREATE_STATIC_LIBRARY";
      return this->GetFeatureSpecificLinkRuleVariable(var, lang, config);
    }
    case cmStateEnums::SHARED_LIBRARY:
      return "CMAKE_" + lang + "_CREATE_SHARED_LIBRARY";
    case cmStateEnums::MODULE_LIBRARY:
      return "CMAKE_" + lang + "_CREATE_SHARED_MODULE";
    case cmStateEnums::EXECUTABLE:
      return "CMAKE_" + lang + "_LINK_EXECUTABLE";
    default:
      break;
  }
  return "";
}